

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<VariableTypeRemap,_8UL>::push_back
          (SmallVector<VariableTypeRemap,_8UL> *this,VariableTypeRemap *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  VariableTypeRemap *pVVar3;
  size_t sVar4;
  pointer pcVar5;
  undefined8 uVar6;
  VariableTypeRemap *pVVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  
  reserve(this,(this->super_VectorView<VariableTypeRemap>).buffer_size + 1);
  pVVar7 = (this->super_VectorView<VariableTypeRemap>).ptr;
  sVar4 = (this->super_VectorView<VariableTypeRemap>).buffer_size;
  pVVar3 = pVVar7 + sVar4;
  pVVar7 = pVVar7 + sVar4;
  paVar8 = &(pVVar7->variable_name).field_2;
  (pVVar7->variable_name)._M_dataplus._M_p = (pointer)paVar8;
  pcVar5 = (t->variable_name)._M_dataplus._M_p;
  paVar1 = &(t->variable_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar6 = *(undefined8 *)((long)&(t->variable_name).field_2 + 8);
    paVar8->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(pVVar7->variable_name).field_2 + 8) = uVar6;
  }
  else {
    (pVVar3->variable_name)._M_dataplus._M_p = pcVar5;
    (pVVar3->variable_name).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (pVVar3->variable_name)._M_string_length = (t->variable_name)._M_string_length;
  (t->variable_name)._M_dataplus._M_p = (pointer)paVar1;
  (t->variable_name)._M_string_length = 0;
  (t->variable_name).field_2._M_local_buf[0] = '\0';
  paVar1 = &(pVVar3->new_variable_type).field_2;
  (pVVar3->new_variable_type)._M_dataplus._M_p = (pointer)paVar1;
  pcVar5 = (t->new_variable_type)._M_dataplus._M_p;
  paVar8 = &(t->new_variable_type).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar8) {
    uVar6 = *(undefined8 *)((long)&(t->new_variable_type).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&(pVVar3->new_variable_type).field_2 + 8) = uVar6;
  }
  else {
    (pVVar3->new_variable_type)._M_dataplus._M_p = pcVar5;
    (pVVar3->new_variable_type).field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  (pVVar3->new_variable_type)._M_string_length = (t->new_variable_type)._M_string_length;
  (t->new_variable_type)._M_dataplus._M_p = (pointer)paVar8;
  (t->new_variable_type)._M_string_length = 0;
  (t->new_variable_type).field_2._M_local_buf[0] = '\0';
  psVar2 = &(this->super_VectorView<VariableTypeRemap>).buffer_size;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}